

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RefCntAutoPtr.hpp
# Opt level: O0

RefCntAutoPtr<Diligent::IShader> * __thiscall
Diligent::RefCntAutoPtr<Diligent::IShader>::operator=
          (RefCntAutoPtr<Diligent::IShader> *this,IShader *pObj)

{
  IShader *pObj_local;
  RefCntAutoPtr<Diligent::IShader> *this_local;
  
  if (this->m_pObject != pObj) {
    if (this->m_pObject != (IShader *)0x0) {
      (*(this->m_pObject->super_IDeviceObject).super_IObject._vptr_IObject[2])();
    }
    this->m_pObject = pObj;
    if (this->m_pObject != (IShader *)0x0) {
      (*(this->m_pObject->super_IDeviceObject).super_IObject._vptr_IObject[1])();
    }
  }
  return this;
}

Assistant:

RefCntAutoPtr& operator=(T* pObj) noexcept
    {
        if (m_pObject != pObj)
        {
            if (m_pObject)
                m_pObject->Release();
            m_pObject = pObj;
            if (m_pObject)
                m_pObject->AddRef();
        }
        return *this;
    }